

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_global(Context *ctx,RegisterType regtype,int regnum)

{
  int iVar1;
  char *pcVar2;
  size_t in_R8;
  char varname [64];
  
  get_GLSL_varname_in_buf(ctx,regtype,regnum,varname,in_R8);
  push_output(ctx,&ctx->globals);
  if (regtype == REG_TYPE_TEMP) {
    pcVar2 = "vec4 %s;";
  }
  else if (regtype == REG_TYPE_MAX) {
    pcVar2 = "bvec4 %s;";
  }
  else {
    if ((regtype == REG_TYPE_LOOP) || (regtype == REG_TYPE_LABEL)) goto LAB_0010b014;
    if (regtype != REG_TYPE_ADDRESS) {
      fail(ctx,"BUG: we used a register we don\'t know how to define.");
      goto LAB_0010b014;
    }
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
      iVar1 = shader_version_atleast(ctx,'\x01','\x04');
      if (iVar1 == 0) {
        if (ctx->profile_supports_glsles == 0) {
          pcVar2 = "vec4 %s = gl_TexCoord[%d];";
        }
        else {
          pcVar2 = "vec4 %s = v_TexCoord[%d];";
        }
        output_line(ctx,pcVar2,varname,(ulong)(uint)regnum);
      }
      goto LAB_0010b014;
    }
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) goto LAB_0010b014;
    pcVar2 = "ivec4 %s;";
  }
  output_line(ctx,pcVar2,varname);
LAB_0010b014:
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_global(Context *ctx, RegisterType regtype, int regnum)
{
    char varname[64];
    get_GLSL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);
    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_vertex(ctx))
                output_line(ctx, "ivec4 %s;", varname);
            else if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        output_line(ctx, "vec4 %s = v_TexCoord[%d];",
                                    varname, regnum);
                    else
#endif
                    output_line(ctx, "vec4 %s = gl_TexCoord[%d];",
                                varname, regnum);
                } // if
            } // else if
            break;
        case REG_TYPE_PREDICATE:
            output_line(ctx, "bvec4 %s;", varname);
            break;
        case REG_TYPE_TEMP:
            output_line(ctx, "vec4 %s;", varname);
            break;
        case REG_TYPE_LOOP:
            break; // no-op. We declare these in for loops at the moment.
        case REG_TYPE_LABEL:
            break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch
    pop_output(ctx);
}